

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceAABB.cpp
# Opt level: O2

AABB * __thiscall IceMaths::AABB::Add(AABB *this,AABB *aabb)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Point local_28;
  Point local_18;
  
  local_28.z = (this->mCenter).z;
  fVar1 = (this->mExtents).z;
  local_18.z = local_28.z - fVar1;
  fVar12 = (aabb->mCenter).z;
  fVar2 = (aabb->mExtents).z;
  fVar13 = fVar12 - fVar2;
  if (fVar13 <= local_18.z) {
    local_18.z = fVar13;
  }
  uVar3 = (this->mCenter).x;
  uVar7 = (this->mCenter).y;
  uVar4 = (this->mExtents).x;
  uVar8 = (this->mExtents).y;
  auVar15._0_4_ = (float)uVar3 - (float)uVar4;
  auVar15._4_4_ = (float)uVar7 - (float)uVar8;
  auVar15._8_8_ = 0;
  uVar5 = (aabb->mCenter).x;
  uVar9 = (aabb->mCenter).y;
  uVar6 = (aabb->mExtents).x;
  uVar10 = (aabb->mExtents).y;
  auVar16._4_4_ = (float)uVar9 - (float)uVar10;
  auVar16._0_4_ = (float)uVar5 - (float)uVar6;
  auVar16._8_8_ = 0;
  auVar16 = minps(auVar15,auVar16);
  local_18._0_8_ = auVar16._0_8_;
  local_28.z = local_28.z + fVar1;
  fVar12 = fVar12 + fVar2;
  if (local_28.z <= fVar12) {
    local_28.z = fVar12;
  }
  auVar14._0_4_ = (float)uVar3 + (float)uVar4;
  auVar14._4_4_ = (float)uVar7 + (float)uVar8;
  auVar14._8_8_ = 0;
  auVar11._4_4_ = (float)uVar9 + (float)uVar10;
  auVar11._0_4_ = (float)uVar5 + (float)uVar6;
  auVar11._8_8_ = 0;
  auVar16 = maxps(auVar14,auVar11);
  local_28._0_8_ = auVar16._0_8_;
  SetMinMax(this,&local_18,&local_28);
  return this;
}

Assistant:

AABB& AABB::Add(const AABB& aabb)
{
	// Compute new min & max values
	Point Min;	GetMin(Min);
	Point Tmp;	aabb.GetMin(Tmp);
	Min.Min(Tmp);

	Point Max;	GetMax(Max);
	aabb.GetMax(Tmp);
	Max.Max(Tmp);

	// Update this
	SetMinMax(Min, Max);
	return *this;
}